

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

void convert_giov(armci_giov_t *a,comex_giov_t *b,int len)

{
  int i;
  int len_local;
  comex_giov_t *b_local;
  armci_giov_t *a_local;
  
  for (i = 0; i < len; i = i + 1) {
    b[i].src = a[i].src_ptr_array;
    b[i].dst = a[i].dst_ptr_array;
    b[i].count = a[i].ptr_array_len;
    b[i].bytes = a[i].bytes;
  }
  return;
}

Assistant:

static void convert_giov(armci_giov_t *a, comex_giov_t *b, int len)
{
    int i;
    for (i=0; i<len; ++i) {
        b[i].src = a[i].src_ptr_array;
        b[i].dst = a[i].dst_ptr_array;
        b[i].count = a[i].ptr_array_len;
        b[i].bytes = a[i].bytes;
    }
}